

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O3

void __thiscall
correctness_critical_size_random_Test::~correctness_critical_size_random_Test
          (correctness_critical_size_random_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(correctness, critical_size_random) {
    size_t CZ = 8 * 1024 * 1024;
    std::string s;
    s.resize(CZ);
    for (auto &c : s) {
        c = static_cast<char>(rand() % 128);
    }
    check_eq(s);
}